

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECoordinates.cpp
# Opt level: O1

CECoordinates * __thiscall
CECoordinates::ConvertToCIRS
          (CECoordinates *__return_storage_ptr__,CECoordinates *this,double jd,double longitude,
          double latitude,double elevation_m,double pressure_hPa,double temperature_celsius,
          double relative_humidity,double dut1,double xp,double yp,double wavelength_um)

{
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double glon;
  double glat;
  double extraout_XMM0_Qa_01;
  double zen;
  double input_ra;
  double input_dec;
  double ycoord_new;
  double xcoord_new;
  double local_a8;
  double local_a0;
  CEAngle local_98;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  CECoordinateType local_54;
  CEDate local_50;
  
  local_a0 = 0.0;
  local_a8 = 0.0;
  switch(this->coord_type_) {
  case CIRS:
    CppEphem::julian_date_J2000();
    (*this->_vptr_CECoordinates[5])(this);
    local_a0 = extraout_XMM0_Qa;
    CppEphem::julian_date_J2000();
    (*this->_vptr_CECoordinates[7])(this);
    local_a8 = extraout_XMM0_Qa_00;
    break;
  case ICRS:
    CppEphem::julian_date_J2000();
    (*this->_vptr_CECoordinates[5])(this);
    CppEphem::julian_date_J2000();
    (*this->_vptr_CECoordinates[7])(this);
    CEDate::CEDate(&local_50,jd,JD);
    local_98._vptr_CEAngle._0_4_ = 1;
    ICRS2CIRS(input_ra,input_dec,&local_a0,&local_a8,&local_50,(CEAngleType *)&local_98);
    goto LAB_00123b79;
  case GALACTIC:
    CppEphem::julian_date_J2000();
    (*this->_vptr_CECoordinates[5])(this);
    CppEphem::julian_date_J2000();
    (*this->_vptr_CECoordinates[7])(this);
    CEDate::CEDate(&local_50,jd,JD);
    local_98._vptr_CEAngle._0_4_ = 1;
    Galactic2CIRS(glon,glat,&local_a0,&local_a8,&local_50,(CEAngleType *)&local_98);
LAB_00123b79:
    CEDate::~CEDate(&local_50);
    break;
  case OBSERVED:
    local_80 = dut1;
    local_78 = relative_humidity;
    local_70 = longitude;
    local_68 = latitude;
    local_60 = elevation_m;
    CppEphem::julian_date_J2000();
    (*this->_vptr_CECoordinates[5])(this);
    local_88 = extraout_XMM0_Qa_01;
    CppEphem::julian_date_J2000();
    (*this->_vptr_CECoordinates[7])(this);
    Observed2CIRS(local_88,zen,&local_a0,&local_a8,jd,local_70,local_68,local_60,pressure_hPa,
                  temperature_celsius,local_78,local_80,xp,yp,wavelength_um);
  }
  CEAngle::CEAngle((CEAngle *)&local_50,&local_a0);
  CEAngle::CEAngle(&local_98,&local_a8);
  local_54 = CIRS;
  CECoordinates(__return_storage_ptr__,(CEAngle *)&local_50,&local_98,&local_54);
  CEAngle::~CEAngle(&local_98);
  CEAngle::~CEAngle((CEAngle *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

CECoordinates CECoordinates::ConvertToCIRS(double jd,
                            double longitude,
                            double latitude,
                            double elevation_m,
                            double pressure_hPa,
                            double temperature_celsius,
                            double relative_humidity,
                            double dut1,
                            double xp, double yp,
                            double wavelength_um)
{
    double xcoord_new(0.0);
    double ycoord_new(0.0) ;
    if (coord_type_ == CECoordinateType::CIRS) {
        // CIRS -> CIRS
        xcoord_new = XCoordinate_Rad() ;
        ycoord_new = YCoordinate_Rad() ;
    } else if (coord_type_ == CECoordinateType::ICRS) {
        // ICRS -> CIRS
        ICRS2CIRS(XCoordinate_Rad(), YCoordinate_Rad(),
                  &xcoord_new, &ycoord_new,
                  jd, CEAngleType::RADIANS) ;
    } else if (coord_type_ == CECoordinateType::GALACTIC) {
        // Galactic -> CIRS
        Galactic2CIRS(XCoordinate_Rad(), YCoordinate_Rad(),
                      &xcoord_new, &ycoord_new,
                      jd, CEAngleType::RADIANS) ;
    } else if (coord_type_ == CECoordinateType::OBSERVED) {
        // Observed -> CIRS
        Observed2CIRS(XCoordinate_Rad(), YCoordinate_Rad(),
                      &xcoord_new, &ycoord_new,
                      jd, longitude, latitude,
                      elevation_m, pressure_hPa,
                      temperature_celsius, relative_humidity,
                      dut1, xp, yp, wavelength_um) ;
    }
    
    return CECoordinates(xcoord_new, 
                         ycoord_new,
                         CECoordinateType::CIRS) ;
}